

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real-time-logger-def.h
# Opt level: O3

void __thiscall dynamicgraph::RTLoggerStream::~RTLoggerStream(RTLoggerStream *this)

{
  RealTimeLogger *pRVar1;
  
  if (this->ok_ == true) {
    std::ostream::put((char)this->os_);
    pRVar1 = this->logger_;
    *(ulong *)(pRVar1 + 0x38) =
         (*(long *)(pRVar1 + 0x38) + 1U) %
         (ulong)(*(long *)(pRVar1 + 0x20) - *(long *)(pRVar1 + 0x18) >> 3);
    boost::mutex::unlock((mutex *)(pRVar1 + 0x150));
  }
  return;
}

Assistant:

RTLoggerStream::~RTLoggerStream() {
  if (ok_) {
    os_ << std::ends;
    logger_->frontReady();
  }
}